

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O3

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprDeclToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guard,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  ExprType EVar4;
  long lVar5;
  Lexer *pLVar6;
  undefined4 uVar7;
  Lexer *pLVar8;
  pointer __p;
  Lexer *pLVar9;
  undefined8 *in_R8;
  Parser *this_00;
  undefined1 uVar10;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_58;
  istream *local_50;
  Lexer *local_48;
  undefined1 local_40 [16];
  
  pLVar6 = (Lexer *)(guard->_M_t).
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (*(ExprType *)&pLVar6->filePath == EXPR_UNOP) {
    if (pLVar6->_vptr_Lexer != (_func_int **)&PTR__UnOpExpr_0012b9b8) {
      __cxa_bad_cast();
    }
    if (*(short *)((pLVar6->fileContent)._M_dataplus._M_p + 0x10) == 0x5b) {
      (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      pLVar9 = (Lexer *)(pLVar6->fileContent)._M_string_length;
      (pLVar6->fileContent)._M_string_length = 0;
      local_58._M_head_impl = (Expr *)pLVar6;
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)&local_58
                );
      uVar10 = 1;
      goto LAB_00114f0a;
    }
  }
  else if (*(ExprType *)&pLVar6->filePath == EXPR_BIOP) {
    if (pLVar6->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_0012b990) {
      __cxa_bad_cast();
    }
    if (*(short *)&((Expr *)&pLVar6->fileContent)->parent == 0x53) {
      pLVar9 = ((Expr *)&pLVar6->fileContent)->lexer;
      EVar4 = *(ExprType *)&(pLVar9->filePath)._M_dataplus._M_p;
      if (EVar4 == EXPR_UNOP) {
        if (pLVar9->_vptr_Lexer != (_func_int **)&PTR__UnOpExpr_0012b9b8) {
          __cxa_bad_cast();
        }
        if (*(short *)((pLVar9->fileContent)._M_dataplus._M_p + 0x10) != 0x45) goto LAB_00114f4c;
        (pLVar6->fileContent).field_2._M_allocated_capacity = 0;
        pLVar8 = (Lexer *)(pLVar9->fileContent)._M_string_length;
        (pLVar9->fileContent)._M_string_length = 0;
        local_58._M_head_impl = (Expr *)pLVar9;
        local_48 = pLVar8;
        std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                   &local_58);
        EVar4 = *(ExprType *)&(local_48->filePath)._M_dataplus._M_p;
        uVar7 = (undefined4)CONCAT71((int7)((ulong)pLVar8 >> 8),1);
        pLVar9 = local_48;
      }
      else {
LAB_00114f4c:
        (pLVar6->fileContent).field_2._M_allocated_capacity = 0;
        uVar7 = 0;
      }
      if (EVar4 == EXPR_TOK) {
        local_48 = (Lexer *)CONCAT44(local_48._4_4_,uVar7);
        lVar5 = __dynamic_cast(pLVar9,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar5 == 0) goto LAB_001150ff;
        bVar3 = Token::operator==(*(Token **)(lVar5 + 0x38),TOK_ID);
        if (!bVar3) goto LAB_0011501b;
        local_50 = *(istream **)((long)(pLVar6->fileContent).field_2._M_local_buf + 8);
        if (*(int *)(local_50 + 0x18) == 0x13) {
          if (*(undefined ***)local_50 != &PTR__UnOpExpr_0012b9b8) {
            __cxa_bad_cast();
          }
          if (*(short *)(*(long *)(local_50 + 0x38) + 0x10) == 0x45) {
            local_58._M_head_impl = (Expr *)operator_new(0x38);
            _Var1._M_p = *(pointer *)(local_50 + 0x30);
            *(undefined2 *)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer = 2;
            *(undefined4 *)((long)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer + 4) = 7;
            pLVar6 = *(Lexer **)(local_50 + 0x28);
            *(Expr **)&((Lexer *)local_58._M_head_impl)->cfg = *(Expr **)(local_50 + 0x20);
            ((Lexer *)local_58._M_head_impl)->input = (istream *)pLVar6;
            (((Lexer *)local_58._M_head_impl)->filePath)._M_dataplus._M_p = _Var1._M_p;
            ((Position *)&(((Lexer *)local_58._M_head_impl)->filePath)._M_string_length)->line = 0;
            (((Lexer *)local_58._M_head_impl)->filePath).field_2._M_allocated_capacity = 0;
            *(size_t *)((long)&(((Lexer *)local_58._M_head_impl)->filePath).field_2 + 8) = 0;
            this_00 = (Parser *)local_40;
            goto LAB_0011505c;
          }
        }
        lVar5 = __dynamic_cast(pLVar9,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar5 == 0) {
LAB_001150ff:
          __cxa_bad_cast();
        }
        sVar2 = *(size_type *)(lVar5 + 0x38);
        *(undefined8 *)((long)(pLVar6->fileContent).field_2._M_local_buf + 8) = 0;
        pLVar6 = (Lexer *)operator_new(0x28);
        pLVar6->_vptr_Lexer = (_func_int **)*in_R8;
        *in_R8 = 0;
        *(Expr **)&(pLVar6->cfg).multiLineString =
             (guardResult->_M_t).
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        (guardResult->_M_t).
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
        pLVar6->input = local_50;
        *(char *)&(pLVar6->filePath)._M_dataplus._M_p = (char)local_48;
        (pLVar6->filePath)._M_string_length = sVar2;
      }
      else {
LAB_0011501b:
        local_58._M_head_impl = (Expr *)operator_new(0x38);
        _Var1._M_p = *(pointer *)((long)&(pLVar9->filePath).field_2 + 8);
        *(undefined2 *)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer = 2;
        *(undefined4 *)((long)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer + 4) = 6;
        pLVar6 = (Lexer *)(pLVar9->filePath).field_2._M_allocated_capacity;
        *(Expr **)&((Lexer *)local_58._M_head_impl)->cfg =
             (Expr *)((Position *)&(pLVar9->filePath)._M_string_length)->line;
        ((Lexer *)local_58._M_head_impl)->input = (istream *)pLVar6;
        (((Lexer *)local_58._M_head_impl)->filePath)._M_dataplus._M_p = _Var1._M_p;
        ((Position *)&(((Lexer *)local_58._M_head_impl)->filePath)._M_string_length)->line = 0;
        (((Lexer *)local_58._M_head_impl)->filePath).field_2._M_allocated_capacity = 0;
        *(size_t *)((long)&(((Lexer *)local_58._M_head_impl)->filePath).field_2 + 8) = 0;
        this_00 = (Parser *)(local_40 + 8);
LAB_0011505c:
        generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                               *)expr);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   this_00);
        if ((Lexer *)local_58._M_head_impl != (Lexer *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_58,
                     (Error<pfederc::SyntaxErrorCode> *)local_58._M_head_impl);
        }
        pLVar6 = (Lexer *)0x0;
      }
      this->lexer = pLVar6;
      (*pLVar9->_vptr_Lexer[1])(pLVar9);
      return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
              )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
                )this;
    }
  }
  (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  uVar10 = 0;
  pLVar9 = pLVar6;
LAB_00114f0a:
  pLVar6 = (Lexer *)operator_new(0x28);
  pLVar6->_vptr_Lexer = (_func_int **)*in_R8;
  *in_R8 = 0;
  *(Expr **)&(pLVar6->cfg).multiLineString =
       (guardResult->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
       ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (guardResult->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
  .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pLVar6->input = (istream *)pLVar9;
  *(undefined1 *)&(pLVar6->filePath)._M_dataplus._M_p = uVar10;
  (pLVar6->filePath)._M_string_length = 0;
  this->lexer = pLVar6;
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprDeclToFunctionParam(
    std::unique_ptr<Expr> &&expr, std::unique_ptr<Expr> &&guard,
    std::unique_ptr<Expr> &&guardResult) noexcept {
  // '&'id ':' expr | id ':' expr | '&' expr | expr
  if (isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    // '&'id ':' expr | id ':' expr
    BiOpExpr &biopdcl = dynamic_cast<BiOpExpr&>(*expr);

    std::unique_ptr<Expr> idexpr;
    bool ismutable;
    if (isUnOpExpr(biopdcl.getLeft(), TokenType::TOK_OP_BAND)) {
      std::unique_ptr<UnOpExpr> unopexpr =
          std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(biopdcl.getLeftPtr().release()));
      ismutable = true;
      idexpr = unopexpr->getExpressionPtr();
    } else {
      idexpr = biopdcl.getLeftPtr();
      ismutable = false;
    }

    if (!isTokenExpr(*idexpr, TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, idexpr->getPosition()));
      return nullptr;
    }

    if (isUnOpExpr(biopdcl.getRight(), TokenType::TOK_OP_BAND)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL, biopdcl.getRight().getPosition()));
      return nullptr;
    }

    return std::make_unique<FuncParameter>(
      &dynamic_cast<const TokenExpr&>(*idexpr).getToken(),
      ismutable,
      biopdcl.getRightPtr(),
      std::move(guard), std::move(guardResult));
  }
  // '&' expr | expr
  std::unique_ptr<Expr> typeexpr;
  bool ismutable;
  if (isUnOpExpr(*expr, TokenType::TOK_OP_MUT)) {
    std::unique_ptr<UnOpExpr> unopexpr =
      std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(expr.release()));
    typeexpr = unopexpr->getExpressionPtr();
    ismutable = true;
  } else {
    typeexpr = std::move(expr);
    ismutable = false;
  }

  return std::make_unique<FuncParameter>(
    nullptr, ismutable, std::move(typeexpr),
    std::move(guard), std::move(guardResult));
}